

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Btree *p;
  int iVar1;
  Schema *pSVar2;
  Pager *pPager_00;
  char *pcVar3;
  int iDb;
  Pager *pPager;
  char *z;
  sqlite3_vfs *pVfs;
  char *zErrDyn;
  Db *pNew;
  Db *aNew;
  char *pcStack_50;
  uint flags;
  char *zErr;
  char *zPath;
  char *zFile;
  char *zName;
  sqlite3 *db;
  int rc;
  int i;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db._0_4_ = 0;
  _rc = argv;
  argv_local._4_4_ = NotUsed;
  psStack_10 = context;
  zName = (char *)sqlite3_context_db_handle(context);
  zErr = (char *)0x0;
  pcStack_50 = (char *)0x0;
  pVfs = (sqlite3_vfs *)0x0;
  zPath = (char *)sqlite3_value_text(*_rc);
  zFile = (char *)sqlite3_value_text(_rc[1]);
  if (zPath == (char *)0x0) {
    zPath = "";
  }
  if ((uchar *)zFile == (uchar *)0x0) {
    zFile = "";
  }
  if (*(int *)(zName + 0x28) < *(int *)(zName + 0x8c) + 2) {
    if (zName[0x53] == '\0') {
      pVfs = (sqlite3_vfs *)
             sqlite3MPrintf((sqlite3 *)zName,"cannot ATTACH database within transaction");
    }
    else {
      for (db._4_4_ = 0; db._4_4_ < *(int *)(zName + 0x28); db._4_4_ = db._4_4_ + 1) {
        iVar1 = sqlite3StrICmp(*(char **)(*(long *)(zName + 0x20) + (long)db._4_4_ * 0x20),zFile);
        if (iVar1 == 0) {
          pVfs = (sqlite3_vfs *)
                 sqlite3MPrintf((sqlite3 *)zName,"database %s is already in use",zFile);
          goto LAB_001b008e;
        }
      }
      if (*(char **)(zName + 0x20) == zName + 0x230) {
        pNew = (Db *)sqlite3DbMallocRawNN((sqlite3 *)zName,0x60);
        if (pNew == (Db *)0x0) {
          return;
        }
        memcpy(pNew,*(void **)(zName + 0x20),0x40);
      }
      else {
        pNew = (Db *)sqlite3DbRealloc((sqlite3 *)zName,*(void **)(zName + 0x20),
                                      (long)(*(int *)(zName + 0x28) + 1) << 5);
        if (pNew == (Db *)0x0) {
          return;
        }
      }
      *(Db **)(zName + 0x20) = pNew;
      zErrDyn = (char *)(*(long *)(zName + 0x20) + (long)*(int *)(zName + 0x28) * 0x20);
      memset(zErrDyn,0,0x20);
      aNew._4_4_ = *(uint *)(zName + 0x40);
      db._0_4_ = sqlite3ParseUri(*(char **)(*(long *)zName + 0x18),zPath,(uint *)((long)&aNew + 4),
                                 (sqlite3_vfs **)&z,&zErr,&stack0xffffffffffffffb0);
      if ((int)db != 0) {
        if ((int)db == 7) {
          sqlite3OomFault((sqlite3 *)zName);
        }
        sqlite3_result_error(psStack_10,pcStack_50,-1);
        sqlite3_free(pcStack_50);
        return;
      }
      aNew._4_4_ = aNew._4_4_ | 0x100;
      db._0_4_ = sqlite3BtreeOpen((sqlite3_vfs *)z,zErr,(sqlite3 *)zName,(Btree **)(zErrDyn + 8),0,
                                  aNew._4_4_);
      sqlite3_free(zErr);
      *(int *)(zName + 0x28) = *(int *)(zName + 0x28) + 1;
      zName[0x5d] = '\0';
      if ((int)db == 0x13) {
        db._0_4_ = 1;
        pVfs = (sqlite3_vfs *)sqlite3MPrintf((sqlite3 *)zName,"database is already attached");
      }
      else if ((int)db == 0) {
        pSVar2 = sqlite3SchemaGet((sqlite3 *)zName,*(Btree **)(zErrDyn + 8));
        *(Schema **)(zErrDyn + 0x18) = pSVar2;
        if (*(long *)(zErrDyn + 0x18) == 0) {
          db._0_4_ = 7;
        }
        else if ((*(char *)(*(long *)(zErrDyn + 0x18) + 0x70) != '\0') &&
                (*(char *)(*(long *)(zErrDyn + 0x18) + 0x71) != zName[0x52])) {
          pVfs = (sqlite3_vfs *)
                 sqlite3MPrintf((sqlite3 *)zName,
                                "attached databases must use the same text encoding as main database"
                               );
          db._0_4_ = 1;
        }
        sqlite3BtreeEnter(*(Btree **)(zErrDyn + 8));
        pPager_00 = sqlite3BtreePager(*(Btree **)(zErrDyn + 8));
        sqlite3PagerLockingMode(pPager_00,(uint)(byte)zName[0x57]);
        p = *(Btree **)(zErrDyn + 8);
        iVar1 = sqlite3BtreeSecureDelete(*(Btree **)(*(long *)(zName + 0x20) + 8),-1);
        sqlite3BtreeSecureDelete(p,iVar1);
        sqlite3BtreeSetPagerFlags(*(Btree **)(zErrDyn + 8),*(uint *)(zName + 0x2c) & 0x38 | 3);
        sqlite3BtreeLeave(*(Btree **)(zErrDyn + 8));
      }
      zErrDyn[0x10] = '\x03';
      pcVar3 = sqlite3DbStrDup((sqlite3 *)zName,zFile);
      *(char **)zErrDyn = pcVar3;
      if (((int)db == 0) && (*(long *)zErrDyn == 0)) {
        db._0_4_ = 7;
      }
      if ((int)db == 0) {
        sqlite3BtreeEnterAll((sqlite3 *)zName);
        db._0_4_ = sqlite3Init((sqlite3 *)zName,(char **)&pVfs);
        sqlite3BtreeLeaveAll((sqlite3 *)zName);
      }
      if ((int)db == 0) {
        return;
      }
      iVar1 = *(int *)(zName + 0x28) + -1;
      if (*(long *)(*(long *)(zName + 0x20) + (long)iVar1 * 0x20 + 8) != 0) {
        sqlite3BtreeClose(*(Btree **)(*(long *)(zName + 0x20) + (long)iVar1 * 0x20 + 8));
        *(undefined8 *)(*(long *)(zName + 0x20) + (long)iVar1 * 0x20 + 8) = 0;
        *(undefined8 *)(*(long *)(zName + 0x20) + (long)iVar1 * 0x20 + 0x18) = 0;
      }
      sqlite3ResetAllSchemasOfConnection((sqlite3 *)zName);
      *(int *)(zName + 0x28) = iVar1;
      if (((int)db == 7) || ((int)db == 0xc0a)) {
        sqlite3OomFault((sqlite3 *)zName);
        sqlite3DbFree((sqlite3 *)zName,pVfs);
        pVfs = (sqlite3_vfs *)sqlite3MPrintf((sqlite3 *)zName,"out of memory");
      }
      else if (pVfs == (sqlite3_vfs *)0x0) {
        pVfs = (sqlite3_vfs *)sqlite3MPrintf((sqlite3 *)zName,"unable to open database: %s",zPath);
      }
    }
  }
  else {
    pVfs = (sqlite3_vfs *)
           sqlite3MPrintf((sqlite3 *)zName,"too many attached databases - max %d",
                          (ulong)*(uint *)(zName + 0x8c));
  }
LAB_001b008e:
  if (pVfs != (sqlite3_vfs *)0x0) {
    sqlite3_result_error(psStack_10,(char *)pVfs,-1);
    sqlite3DbFree((sqlite3 *)zName,pVfs);
  }
  if ((int)db != 0) {
    sqlite3_result_error_code(psStack_10,(int)db);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);

  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

  /* Check for the following errors:
  **
  **     * Too many attached databases,
  **     * Transaction currently open
  **     * Specified database name already being used.
  */
  if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
    zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
      db->aLimit[SQLITE_LIMIT_ATTACHED]
    );
    goto attach_error;
  }
  if( !db->autoCommit ){
    zErrDyn = sqlite3MPrintf(db, "cannot ATTACH database within transaction");
    goto attach_error;
  }
  for(i=0; i<db->nDb; i++){
    char *z = db->aDb[i].zDbSName;
    assert( z && zName );
    if( sqlite3StrICmp(z, zName)==0 ){
      zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
      goto attach_error;
    }
  }

  /* Allocate the new entry in the db->aDb[] array and initialize the schema
  ** hash tables.
  */
  if( db->aDb==db->aDbStatic ){
    aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
    if( aNew==0 ) return;
    memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
  }else{
    aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
    if( aNew==0 ) return;
  }
  db->aDb = aNew;
  pNew = &db->aDb[db->nDb];
  memset(pNew, 0, sizeof(*pNew));

  /* Open the database file. If the btree is successfully opened, use
  ** it to obtain the database schema. At this point the schema may
  ** or may not be initialized.
  */
  flags = db->openFlags;
  rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
    return;
  }
  assert( pVfs );
  flags |= SQLITE_OPEN_MAIN_DB;
  rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
  sqlite3_free( zPath );
  db->nDb++;
  db->skipBtreeMutex = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  pNew->zDbSName = sqlite3DbStrDup(db, zName);
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from the main database */
        sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
        if( nKey || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
          rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        }
        break;
    }
  }
#endif

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the way
  ** we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    rc = sqlite3Init(db, &zErrDyn);
    sqlite3BtreeLeaveAll(db);
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    int iDb = db->nDb - 1;
    assert( iDb>=2 );
    if( db->aDb[iDb].pBt ){
      sqlite3BtreeClose(db->aDb[iDb].pBt);
      db->aDb[iDb].pBt = 0;
      db->aDb[iDb].pSchema = 0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = iDb;
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
      sqlite3OomFault(db);
      sqlite3DbFree(db, zErrDyn);
      zErrDyn = sqlite3MPrintf(db, "out of memory");
    }else if( zErrDyn==0 ){
      zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}